

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameStage.cpp
# Opt level: O2

void __thiscall GameOverStage::GameOverStage(GameOverStage *this)

{
  GLFWwindow *handle;
  TextPrinter *pTVar1;
  pointer __p;
  allocator<char> local_61;
  int height;
  int width;
  string local_58;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_38;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_28;
  
  (this->super_GameStage)._vptr_GameStage = (_func_int **)&PTR_renderFrame_001a1340;
  (this->m_text)._M_t.super___uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_>._M_t.
  super__Tuple_impl<0UL,_TextPrinter_*,_std::default_delete<TextPrinter>_>.
  super__Head_base<0UL,_TextPrinter_*,_false>._M_head_impl = (TextPrinter *)0x0;
  glClearColor(0x3f800000,0x3f333333,0x3ecccccd,0x3f800000);
  handle = glfwGetCurrentContext();
  glfwGetFramebufferSize(handle,&width,&height);
  pTVar1 = (TextPrinter *)operator_new(0x90);
  TextPrinter::TextPrinter(pTVar1,width,height);
  local_58._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_>::reset
            ((__uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_> *)&this->m_text,pTVar1
            );
  std::unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_>::~unique_ptr
            ((unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_> *)&local_58);
  pTVar1 = (this->m_text)._M_t.super___uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_>
           ._M_t.super__Tuple_impl<0UL,_TextPrinter_*,_std::default_delete<TextPrinter>_>.
           super__Head_base<0UL,_TextPrinter_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"GAME OVER!",&local_61);
  local_38._0_8_ = 0x3f800000;
  local_38.field_0.z = 0.0;
  local_28._0_8_ = 0x3f8000003f800000;
  local_28._8_8_ = 0x3f800000;
  TextPrinter::printText
            (pTVar1,&local_58,0,3,10,(vec3 *)&local_38.field_0,(vec4 *)&local_28.field_0,0);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

GameOverStage::GameOverStage()
{
  glClearColor(1, 0.7, 0.4, 1);
  int width, height;
  GLFWwindow * window = glfwGetCurrentContext();
  glfwGetFramebufferSize(window, &width, &height);
  m_text = std::unique_ptr<TextPrinter>(new TextPrinter(width, height));
  m_text->printText("GAME OVER!", 0, 3, 10, glm::vec3(1, 0, 0));
}